

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

bool Emitter::addEmitter(Junction *junc,double c,double e,Pattern *p)

{
  Emitter *this;
  Pattern *p_local;
  double e_local;
  double c_local;
  Junction *junc_local;
  
  if (junc->emitter == (Emitter *)0x0) {
    this = (Emitter *)operator_new(0x18);
    Emitter(this);
    junc->emitter = this;
    if (junc->emitter == (Emitter *)0x0) {
      return false;
    }
  }
  junc->emitter->flowCoeff = c;
  junc->emitter->expon = e;
  junc->emitter->timePattern = p;
  return true;
}

Assistant:

bool Emitter::addEmitter(Junction* junc, double c, double e, Pattern* p)
{
    if ( junc->emitter == nullptr )
    {
        junc->emitter = new Emitter();
        if ( junc->emitter == nullptr ) return false;
    }
    junc->emitter->flowCoeff = c;
    junc->emitter->expon = e;
    junc->emitter->timePattern = p;
    return true;
}